

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jessilib::ustring_to_mbstring<char8_t>
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string)

{
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  ulong __n;
  decode_result dVar1;
  size_t bytes_written;
  char buffer [16];
  undefined4 uStack_4c;
  undefined1 local_40 [8];
  decode_result decode;
  mbstate_t mbstate;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_local;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *result;
  
  mbstate.__count._3_1_ = 0;
  unique0x100001a6 = this;
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__);
  memset((void *)((long)&decode.units + 4),0,8);
  decode_result::decode_result((decode_result *)local_40);
  while( true ) {
    in_string_00._M_str = (char8_t *)in_string._M_len;
    in_string_00._M_len = (size_t)stack0xffffffffffffffe0;
    dVar1 = decode_codepoint<char8_t>(in_string_00);
    decode._0_8_ = dVar1.units;
    local_40 = (undefined1  [8])CONCAT44(uStack_4c,dVar1.codepoint);
    if (decode._0_8_ == 0) {
      __return_storage_ptr__->first = true;
      return __return_storage_ptr__;
    }
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&mbstate.__value,
               decode._0_8_);
    __n = c32rtomb(&bytes_written,(ulong)local_40 & 0xffffffff,
                   (undefined1 *)((long)&decode.units + 4));
    if (0x10 < __n) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&__return_storage_ptr__->second,(char *)&bytes_written,__n);
  }
  __return_storage_ptr__->first = false;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}